

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arsenal.cpp
# Opt level: O0

string * AfterburnerUtil::trim(string *str)

{
  undefined1 uVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  string *in_RSI;
  string *in_RDI;
  size_t ii;
  long number_of_char;
  string *tmp;
  undefined8 local_28;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  for (local_28 = 0; uVar2 = std::__cxx11::string::size(), local_28 < uVar2; local_28 = local_28 + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if ((*pcVar3 != ' ') &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI), *pcVar3 != '\t')) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
      uVar1 = *puVar4;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar4 = uVar1;
    }
  }
  std::__cxx11::string::resize((ulong)in_RDI);
  return in_RDI;
}

Assistant:

std::string trim(std::string str) {
    // Convert all character in string to lower case
    std::string tmp = str;
    long number_of_char = 0;
    for (size_t ii = 0; ii < str.size(); ii++) {
        if (str[ii] != ' ' && str[ii] != '\t') {
            tmp[number_of_char] = str[ii];
            number_of_char++;
        }
    }
    tmp.resize(number_of_char);
    return tmp;
}